

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateDynCalls.cpp
# Opt level: O3

void __thiscall wasm::GenerateDynCalls::visitFunction(GenerateDynCalls *this,Function *func)

{
  char *pcVar1;
  bool bVar2;
  size_t sVar3;
  Iterator __first;
  Signature sig_00;
  Iterator __last;
  undefined1 local_70 [8];
  Signature sig;
  vector<wasm::Type,_std::allocator<wasm::Type>_> newParams;
  Type local_40;
  Tuple local_38;
  
  pcVar1 = (func->super_Importable).module.super_IString.str._M_str;
  if ((pcVar1 != (char *)0x0) && (pcVar1 == DAT_00da8600)) {
    bVar2 = IString::startsWith<8>
                      (&(func->super_Importable).base.super_IString,(char (*) [8])"invoke_");
    if (bVar2) {
      _local_70 = HeapType::getSignature(&func->type);
      sVar3 = wasm::Type::size((Type *)local_70);
      __first.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = 1;
      __first.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)local_70;
      __last.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = sVar3;
      __last.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)local_70;
      std::vector<wasm::Type,std::allocator<wasm::Type>>::vector<wasm::Type::Iterator,void>
                ((vector<wasm::Type,std::allocator<wasm::Type>> *)&sig.results,__first,__last,
                 (allocator_type *)&local_38);
      Tuple::Tuple(&local_38,(TypeList *)&sig.results);
      wasm::Type::Type(&local_40,&local_38);
      sig_00.results.id = sig.params.id;
      sig_00.params.id = local_40.id;
      HeapType::HeapType((HeapType *)
                         &newParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,sig_00);
      InsertOrderedSet<wasm::HeapType>::insert
                (&this->invokeTypes,
                 (HeapType *)
                 &newParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      if (local_38.types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_38.types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_38.types.
                              super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_38.types.
                              super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (sig.results.id != 0) {
        operator_delete((void *)sig.results.id,
                        (long)newParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                              _M_impl.super__Vector_impl_data._M_finish - sig.results.id);
      }
    }
  }
  return;
}

Assistant:

void visitFunction(Function* func) {
    // Generate dynCalls for invokes
    if (func->imported() && func->module == ENV &&
        func->base.startsWith("invoke_")) {
      Signature sig = func->type.getSignature();
      // The first parameter is a pointer to the original function that's called
      // by the invoke, so skip it
      std::vector<Type> newParams(sig.params.begin() + 1, sig.params.end());
      invokeTypes.insert(Signature(Type(newParams), sig.results));
    }
  }